

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGI.cpp
# Opt level: O2

CharContent * __thiscall
CGI::make_environment
          (CharContent *__return_storage_ptr__,CGI *this,Request *request,CharContent *cgi_key)

{
  bool bVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  size_t sVar4;
  size_t sVar5;
  char *__s;
  sockaddr_in local_sock;
  CharContent path;
  socklen_t local_sock_len;
  undefined3 uStack_28;
  socklen_t local_sock_len_1;
  
  bVar1 = operator==(cgi_key,"REQUEST_METHOD");
  if (bVar1) goto LAB_0010acb2;
  bVar1 = operator==(cgi_key,"CONTENT_TYPE");
  if (bVar1) {
    CharContent::CharContent(&path,"Content-Type");
    iVar2 = std::
            _Hashtable<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(request->headers)._M_h,&path);
    if (iVar2.super__Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true>._M_cur ==
        (__node_type *)0x0) {
      CharContent::CharContent(__return_storage_ptr__,"");
      goto LAB_0010af23;
    }
    CharContent::CharContent((CharContent *)&local_sock,"Content-Type");
    pmVar3 = std::__detail::
             _Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&request->headers,(key_type *)&local_sock);
    CharContent::CharContent(__return_storage_ptr__,pmVar3);
  }
  else {
    bVar1 = operator==(cgi_key,"CONTENT_LENGTH");
    if (!bVar1) {
      bVar1 = operator==(cgi_key,"QUERY_STRING");
      if (bVar1) {
        CharContent::CharContent(&path,&request->uri);
        CharContent::CharContent((CharContent *)&local_sock,"?");
        sVar4 = CharContent::find(&path,(CharContent *)&local_sock,0);
        CharContent::~CharContent((CharContent *)&local_sock);
        if (sVar4 == CONCAT35(path.npos._5_3_,(undefined5)path.npos)) {
          CharContent::CharContent(__return_storage_ptr__,"");
        }
        else {
          sVar5 = CharContent::length(&path);
          CharContent::subCharContent(__return_storage_ptr__,&path,sVar4 + 1,sVar5 + ~sVar4);
        }
        goto LAB_0010af23;
      }
      bVar1 = operator==(cgi_key,"SCRIPT_NAME");
      if (bVar1) {
        CharContent::CharContent(&path,&request->uri);
        CharContent::CharContent((CharContent *)&local_sock,"?");
        sVar4 = CharContent::find(&path,(CharContent *)&local_sock,0);
        CharContent::~CharContent((CharContent *)&local_sock);
        if (sVar4 == CONCAT35(path.npos._5_3_,(undefined5)path.npos)) {
          CharContent::CharContent(__return_storage_ptr__,&path);
        }
        else {
          CharContent::subCharContent(__return_storage_ptr__,&path,0,sVar4);
        }
        goto LAB_0010af23;
      }
      bVar1 = operator==(cgi_key,"PATH_INFO");
      if (bVar1) {
        request = (Request *)&this->_name;
LAB_0010acb2:
        CharContent::CharContent(__return_storage_ptr__,&request->method);
        return __return_storage_ptr__;
      }
      bVar1 = operator==(cgi_key,"PATH_TRANSLATED");
      if (bVar1) {
        request = (Request *)&this->_path;
        goto LAB_0010acb2;
      }
      bVar1 = operator==(cgi_key,"REMOTE_ADDR");
      if ((bVar1) || (bVar1 = operator==(cgi_key,"REMOTE_HOST"), bVar1)) {
        local_sock_len = 0x10;
        getpeername(this->_connfd,(sockaddr *)&local_sock,&local_sock_len);
      }
      else {
        bVar1 = operator==(cgi_key,"GATEWAY_INTERFACE");
        if (bVar1) {
          __s = "CGI/1.1";
          goto LAB_0010afa6;
        }
        bVar1 = operator==(cgi_key,"SERVER_NAME");
        if (!bVar1) {
          bVar1 = operator==(cgi_key,"SERVER_PORT");
          if (bVar1) {
            local_sock_len_1 = 0x10;
            getsockname(this->_connfd,(sockaddr *)&local_sock,&local_sock_len_1);
            path._vptr_CharContent = (_func_int **)0x0;
            path.npos._0_5_ = 0;
            path.npos._5_3_ = 0;
            path.m._0_5_ = 0;
            inet_ntop(2,&local_sock.sin_addr,(char *)&path,0x15);
            __s = (char *)&local_sock_len;
            uStack_28 = 0;
            local_sock_len = 0;
            snprintf(__s,7,"%d",(ulong)(ushort)(local_sock.sin_port << 8 | local_sock.sin_port >> 8)
                    );
            goto LAB_0010afa6;
          }
          bVar1 = operator==(cgi_key,"SERVER_PROTOCOL");
          if (bVar1) {
            __s = "HTTP/1.1";
            goto LAB_0010afa6;
          }
          bVar1 = operator==(cgi_key,"HTTP_ACCEPT");
          if (bVar1) {
            CharContent::CharContent(&path,"Content-Type");
            iVar2 = std::
                    _Hashtable<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(&(request->headers)._M_h,&path);
            if (iVar2.super__Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true>.
                _M_cur == (__node_type *)0x0) {
              CharContent::CharContent(__return_storage_ptr__,"");
              goto LAB_0010af23;
            }
            CharContent::CharContent((CharContent *)&local_sock,"Content-Type");
            pmVar3 = std::__detail::
                     _Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&request->headers,(key_type *)&local_sock);
            CharContent::CharContent(__return_storage_ptr__,pmVar3);
          }
          else {
            bVar1 = operator==(cgi_key,"HTTP_USER_AGENT");
            if (bVar1) {
              CharContent::CharContent(&path,"User-Agent");
              iVar2 = std::
                      _Hashtable<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find(&(request->headers)._M_h,&path);
              if (iVar2.super__Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true>.
                  _M_cur == (__node_type *)0x0) {
                CharContent::CharContent(__return_storage_ptr__,"");
                goto LAB_0010af23;
              }
              CharContent::CharContent((CharContent *)&local_sock,"User-Agent");
              pmVar3 = std::__detail::
                       _Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&request->headers,(key_type *)&local_sock);
              CharContent::CharContent(__return_storage_ptr__,pmVar3);
            }
            else {
              bVar1 = operator==(cgi_key,"HTTP_REFERER");
              if (bVar1) {
                CharContent::CharContent(&path,"Referer");
                iVar2 = std::
                        _Hashtable<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::find(&(request->headers)._M_h,&path);
                if (iVar2.super__Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true>
                    ._M_cur == (__node_type *)0x0) {
                  CharContent::CharContent(__return_storage_ptr__,"");
                  goto LAB_0010af23;
                }
                CharContent::CharContent((CharContent *)&local_sock,"Referer");
                pmVar3 = std::__detail::
                         _Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)&request->headers,(key_type *)&local_sock);
                CharContent::CharContent(__return_storage_ptr__,pmVar3);
              }
              else {
                bVar1 = operator==(cgi_key,"HTTP_COOKIE");
                if (!bVar1) {
                  __s = "";
                  goto LAB_0010afa6;
                }
                CharContent::CharContent(&path,"Cookie");
                iVar2 = std::
                        _Hashtable<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::find(&(request->headers)._M_h,&path);
                if (iVar2.super__Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true>
                    ._M_cur == (__node_type *)0x0) {
                  CharContent::CharContent(__return_storage_ptr__,"");
                  goto LAB_0010af23;
                }
                CharContent::CharContent((CharContent *)&local_sock,"Cookie");
                pmVar3 = std::__detail::
                         _Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)&request->headers,(key_type *)&local_sock);
                CharContent::CharContent(__return_storage_ptr__,pmVar3);
              }
            }
          }
          goto LAB_0010ad94;
        }
        local_sock_len = 0x10;
        getsockname(this->_connfd,(sockaddr *)&local_sock,&local_sock_len);
      }
      __s = (char *)&path;
      path._vptr_CharContent = (_func_int **)0x0;
      path.npos._0_5_ = 0;
      path.npos._5_3_ = 0;
      path.m._0_5_ = 0;
      inet_ntop(2,&local_sock.sin_addr,__s,0x15);
LAB_0010afa6:
      CharContent::CharContent(__return_storage_ptr__,__s);
      return __return_storage_ptr__;
    }
    CharContent::CharContent(&path,"Content-Length");
    iVar2 = std::
            _Hashtable<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(request->headers)._M_h,&path);
    if (iVar2.super__Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true>._M_cur ==
        (__node_type *)0x0) {
      CharContent::CharContent(__return_storage_ptr__,"");
      goto LAB_0010af23;
    }
    CharContent::CharContent((CharContent *)&local_sock,"Content-Length");
    pmVar3 = std::__detail::
             _Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&request->headers,(key_type *)&local_sock);
    CharContent::CharContent(__return_storage_ptr__,pmVar3);
  }
LAB_0010ad94:
  CharContent::~CharContent((CharContent *)&local_sock);
LAB_0010af23:
  CharContent::~CharContent(&path);
  return __return_storage_ptr__;
}

Assistant:

CharContent CGI::make_environment(Request request,CharContent cgi_key){
	//to do
	if(cgi_key=="REQUEST_METHOD"){
		return request.method;
	}else if(cgi_key=="CONTENT_TYPE"){
		return request.headers.find("Content-Type")!=request.headers.end()?request.headers["Content-Type"]:"";
	}else if(cgi_key=="CONTENT_LENGTH"){
		return request.headers.find("Content-Length")!=request.headers.end()?request.headers["Content-Length"]:"";
	}else if(cgi_key=="QUERY_STRING"){
		CharContent path=request.uri;
		size_t pos=0;
		if((pos=path.find("?"))==path.npos){
			return "";
		}
		return path.subCharContent(pos+1,path.length()-pos-1);
	}else if(cgi_key=="SCRIPT_NAME"){
		CharContent path=request.uri;
		size_t pos=0;
		if((pos=path.find("?"))==path.npos){
			return path;
		}
		return path.subCharContent(0,pos);
	}else if(cgi_key=="PATH_INFO"){
		return this->_name;
	}else if(cgi_key=="PATH_TRANSLATED"){
		return this->_path;
	}else if(cgi_key=="REMOTE_ADDR"){
		//发送此次请求的主机IP
		sockaddr_in remote_sock;
		socklen_t remote_sock_len=sizeof(remote_sock);
		getpeername(_connfd,(sockaddr *)&remote_sock,&remote_sock_len);
		char client_ip[21]={'\0'};
		inet_ntop(AF_INET, &remote_sock.sin_addr, client_ip, sizeof(client_ip));
		CharContent temp(client_ip);
		return temp;
	}else if(cgi_key=="REMOTE_HOST"){
		//发送此次请求的主机名
		sockaddr_in remote_sock;
		socklen_t remote_sock_len=sizeof(remote_sock);
		getpeername(_connfd,(sockaddr *)&remote_sock,&remote_sock_len);
		char client_ip[21]={'\0'};
		inet_ntop(AF_INET, &remote_sock.sin_addr, client_ip, sizeof(client_ip));
		CharContent temp(client_ip);
		return temp;
	}else if(cgi_key=="GATEWAY_INTERFACE"){
		return CharContent("CGI/1.1");
	}else if(cgi_key=="SERVER_NAME"){
		//服务器主机名、域名或IP
		sockaddr_in local_sock;
		socklen_t local_sock_len=sizeof(local_sock);
		getsockname(_connfd,(sockaddr *)&local_sock,&local_sock_len);
		char server_ip[21]={'\0'};
		inet_ntop(AF_INET, &local_sock.sin_addr, server_ip, sizeof(server_ip));
		CharContent temp(server_ip);
		return temp;
	}else if(cgi_key=="SERVER_PORT"){
		//服务器端口号
		sockaddr_in local_sock;
		socklen_t local_sock_len=sizeof(local_sock);
		getsockname(_connfd,(sockaddr *)&local_sock,&local_sock_len);
		char server_ip[21]={'\0'};
		inet_ntop(AF_INET, &local_sock.sin_addr, server_ip, sizeof(server_ip));
		char server_port[7]={'\0'};
		snprintf(server_port,sizeof(server_port),"%d",ntohs(local_sock.sin_port));
		CharContent temp(server_port);
		return temp;
	}else if(cgi_key=="SERVER_PROTOCOL"){
		return CharContent("HTTP/1.1");
	}else if(cgi_key=="HTTP_ACCEPT"){
		return request.headers.find("Content-Type")!=request.headers.end()?request.headers["Content-Type"]:"";
	}else if(cgi_key=="HTTP_USER_AGENT"){
		return request.headers.find("User-Agent")!=request.headers.end()?request.headers["User-Agent"]:"";
	}else if(cgi_key=="HTTP_REFERER"){
		return request.headers.find("Referer")!=request.headers.end()?request.headers["Referer"]:"";
	}else if(cgi_key=="HTTP_COOKIE"){
		return request.headers.find("Cookie")!=request.headers.end()?request.headers["Cookie"]:"";
	}
	return CharContent("");
}